

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-chat.cpp
# Opt level: O2

int32_t llama_chat_builtin_templates(char **output,size_t len)

{
  size_t sVar1;
  size_t i;
  ulong uVar2;
  const_iterator it;
  
  it._M_node = LLM_CHAT_TEMPLATES_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  uVar2 = 0;
  while( true ) {
    sVar1 = len;
    if (LLM_CHAT_TEMPLATES_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count < len) {
      sVar1 = LLM_CHAT_TEMPLATES_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    if (sVar1 <= uVar2) break;
    output[uVar2] = *(char **)(it._M_node + 1);
    std::
    __advance<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,llm_chat_template>>,long>
              (&it,1);
    uVar2 = uVar2 + 1;
  }
  return (int32_t)LLM_CHAT_TEMPLATES_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count;
}

Assistant:

int32_t llama_chat_builtin_templates(const char ** output, size_t len) {
    auto it = LLM_CHAT_TEMPLATES.begin();
    for (size_t i = 0; i < std::min(len, LLM_CHAT_TEMPLATES.size()); i++) {
        output[i] = it->first.c_str();
        std::advance(it, 1);
    }
    return (int32_t) LLM_CHAT_TEMPLATES.size();
}